

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ElementSize EVar1;
  ListElementCount LVar2;
  uint uVar3;
  PointerReader other;
  StructReader other_00;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  unsigned_long uVar8;
  undefined8 extraout_RAX;
  byte bVar9;
  uint uVar10;
  ListReader *pLVar11;
  int iVar13;
  ListReader *list;
  word *pwVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  uint i_2;
  uint i;
  ElementCount index;
  ulong uVar18;
  ListReader *__begin3;
  AllocateResult AVar19;
  AllocateResult AVar20;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  Exception *local_d8;
  undefined1 local_c8 [32];
  StructDataBitCount local_a8;
  ushort local_a4;
  ListReader *local_a0;
  Fault local_98;
  word *local_90;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  byte *local_78;
  int iStack_70;
  undefined4 uStack_6c;
  StructReader local_60;
  word *pwVar12;
  
  uVar17 = (ulong)(uint)structSize;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
  local_c8._0_8_ = lists.size_;
  local_c8._16_8_ = " > ";
  local_c8._24_8_ = (WirePointer *)0x4;
  local_a8 = CONCAT31(local_a8._1_3_,lists.size_ != 0);
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[25]>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd8d,FAILED,"lists.size() > 0","_kjCondition,\"Can\'t concat empty list \"",
               (DebugComparison<unsigned_long,_int> *)local_c8,
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&local_98);
  }
  uVar6 = (uint)structSize >> 0x10;
  lVar7 = lists.size_ * 0x30;
  local_a0 = lists.ptr + lists.size_;
  uVar16 = 0;
  pLVar11 = lists.ptr;
  while( true ) {
    uVar18 = uVar17 & 0xffff;
    uVar15 = (ushort)uVar6;
    if (lVar7 == 0) break;
    uVar16 = uVar16 + pLVar11->elementCount;
    if (0x1fffffff < uVar16) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                ((Fault *)local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xd93,FAILED,(char *)0x0,"\"concatenated list exceeds list size limit\"",
                 (char (*) [42])"concatenated list exceeds list size limit");
      kj::_::Debug::Fault::fatal((Fault *)local_c8);
    }
    EVar1 = pLVar11->elementSize;
    if (EVar1 != elementSize) {
      local_98.exception._0_1_ = elementSize != BIT && EVar1 != BIT;
      if (elementSize == BIT || EVar1 == BIT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[40]>
                  ((Fault *)local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xd97,FAILED,
                   "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                   "_kjCondition,\"can\'t upgrade bit lists to struct lists\"",(bool *)&local_98,
                   (char (*) [40])"can\'t upgrade bit lists to struct lists");
        kj::_::Debug::Fault::fatal((Fault *)local_c8);
      }
      elementSize = INLINE_COMPOSITE;
    }
    uVar17 = (ulong)pLVar11->structDataSize + 0x3f >> 6;
    if (uVar17 <= uVar18) {
      uVar17 = uVar18;
    }
    if (uVar15 <= pLVar11->structPointerCount) {
      uVar6 = (uint)pLVar11->structPointerCount;
    }
    pLVar11 = pLVar11 + 1;
    lVar7 = lVar7 + -0x30;
  }
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (elementSize == INLINE_COMPOSITE) {
    uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                       (uVar16,(anon_class_1_0_00000001 *)local_c8);
    iVar13 = (int)uVar18;
    uVar8 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                      ((ulong)(uVar6 + iVar13) * (ulong)uVar16,(anon_class_1_0_00000001 *)local_c8);
    if (arena == (BuilderArena *)0x0) {
LAB_0014fcdd:
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
      kj::_::Debug::Fault::~Fault(&local_98);
      _Unwind_Resume(extraout_RAX);
    }
    AVar19 = BuilderArena::allocate(arena,(int)uVar8 + 1);
    local_90 = AVar19.words;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)uVar8 * 8 + 7;
    *(uint *)&local_90->content = uVar16 << 2;
    *(short *)((long)&local_90->content + 4) = (short)uVar17;
    *(ushort *)((long)&local_90->content + 6) = uVar15;
    local_90 = local_90 + 1;
    uVar16 = 0;
    for (; AVar20.words = local_90, AVar20.segment = AVar19.segment, lists.ptr != local_a0;
        lists.ptr = lists.ptr + 1) {
      LVar2 = (lists.ptr)->elementCount;
      for (index = 0; LVar2 != index; index = index + 1) {
        local_c8._16_8_ =
             (long)&local_90->content +
             ((ulong)(uVar16 + index) * (ulong)((uVar6 + iVar13) * 0x40) >> 3);
        local_c8._24_8_ =
             (long)&(((WirePointer *)local_c8._16_8_)->offsetAndKind).value +
             (ulong)(uint)(iVar13 << 3);
        local_c8._0_8_ = (Exception *)AVar19.segment;
        local_c8._8_8_ = capTable;
        local_a8 = iVar13 << 6;
        local_a4 = uVar15;
        ListReader::getStructElement(&local_60,lists.ptr,index);
        other_00.capTable = local_60.capTable;
        other_00.segment = local_60.segment;
        other_00.data = local_60.data;
        other_00.pointers = local_60.pointers;
        other_00.dataSize = local_60.dataSize;
        other_00.pointerCount = local_60.pointerCount;
        other_00._38_2_ = local_60._38_2_;
        other_00.nestingLimit = local_60.nestingLimit;
        other_00._44_4_ = local_60._44_4_;
        StructBuilder::copyContentFrom((StructBuilder *)local_c8,other_00);
      }
      uVar16 = uVar16 + index;
    }
  }
  else {
    uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar16,(anon_class_1_0_00000001 *)local_c8);
    if (arena == (BuilderArena *)0x0) goto LAB_0014fcdd;
    uVar16 = *(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)elementSize * 4);
    AVar20 = BuilderArena::allocate
                       (arena,(SegmentWordCount)((ulong)uVar6 * (ulong)uVar16 + 0x3f >> 6));
    pwVar12 = AVar20.words;
    local_d8 = (Exception *)AVar20.segment;
    *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
    *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar6 << 3 | (uint)elementSize;
    if (elementSize == POINTER) {
      uVar17 = 0;
      for (; lists.ptr != local_a0; lists.ptr = lists.ptr + 1) {
        uVar6 = (lists.ptr)->elementCount;
        for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
          local_c8._16_8_ =
               (long)&pwVar12->content + ((uVar17 + uVar18 & 0xffffffff) * (ulong)uVar16 >> 3);
          local_78 = (lists.ptr)->ptr +
                     ((lists.ptr)->step * uVar18 >> 3) + (ulong)((lists.ptr)->structDataSize >> 3);
          iStack_70 = (lists.ptr)->nestingLimit;
          local_88 = (lists.ptr)->segment;
          pCStack_80 = (lists.ptr)->capTable;
          uVar4 = (lists.ptr)->segment;
          uVar5 = (lists.ptr)->capTable;
          other.capTable = (CapTableReader *)uVar5;
          other.segment = (SegmentReader *)uVar4;
          other._28_4_ = uStack_6c;
          other.nestingLimit = iStack_70;
          other.pointer = (WirePointer *)local_78;
          local_c8._0_8_ = local_d8;
          local_c8._8_8_ = capTable;
          PointerBuilder::copyFrom((PointerBuilder *)local_c8,other,false);
        }
        uVar17 = (ulong)(uint)((int)uVar17 + (int)uVar18);
      }
    }
    else {
      if (elementSize == 1) {
        uVar6 = 0;
        for (; lists.ptr != local_a0; lists.ptr = lists.ptr + 1) {
          uVar16 = (lists.ptr)->elementCount;
          uVar17 = 0;
          while( true ) {
            uVar3 = (uint)uVar17;
            uVar10 = uVar6 + uVar3;
            if (uVar16 == uVar3) break;
            bVar9 = (byte)uVar10 & 7;
            *(byte *)((long)&pwVar12->content + (ulong)(uVar10 >> 3)) =
                 (((lists.ptr)->ptr[uVar17 >> 3] >> (uVar3 & 7) & 1) != 0) << bVar9 |
                 *(byte *)((long)&pwVar12->content + (ulong)(uVar10 >> 3)) & ~(byte)(1 << bVar9);
            uVar17 = (ulong)(uVar3 + 1);
          }
          uVar6 = uVar10;
        }
        goto LAB_0014fbd3;
      }
      lVar7 = 0;
      pLVar11 = lists.ptr;
      while( true ) {
        local_d8 = (Exception *)AVar20.segment;
        if (lists.size_ * 0x30 == lVar7) break;
        uVar18 = (ulong)pLVar11->elementCount * (ulong)(uVar16 >> 3);
        uVar17 = uVar18 & 0xffffffff;
        if (uVar17 != 0) {
          memcpy(AVar20.words,*(void **)((long)&(lists.ptr)->ptr + lVar7),uVar17);
        }
        AVar20.words = (word *)((long)&(AVar20.words)->content + uVar18);
        AVar20.segment = (SegmentBuilder *)local_d8;
        pLVar11 = pLVar11 + 1;
        lVar7 = lVar7 + 0x30;
      }
    }
    AVar20.words = pwVar12;
    AVar20.segment = (SegmentBuilder *)local_d8;
  }
LAB_0014fbd3:
  pwVar14 = AVar20.words;
  local_d8 = (Exception *)AVar20.segment;
  pwVar12 = pwVar14 + -1;
  if (pwVar14 == (word *)0x0) {
    pwVar12 = pwVar14;
  }
  __return_storage_ptr__->segment = (SegmentBuilder *)local_d8;
  __return_storage_ptr__->capTable = capTable;
  if (elementSize != INLINE_COMPOSITE) {
    pwVar12 = pwVar14;
  }
  __return_storage_ptr__->location = pwVar12;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}